

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O1

int Cudd_bddVarConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  DdHalfWord i;
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  int *piVar6;
  DdHalfWord i_00;
  int iVar7;
  
  pDVar3 = Cudd_Support(dd,f);
  if (pDVar3 == (DdNode *)0x0) {
    return 0;
  }
  piVar6 = (int *)((ulong)pDVar3 & 0xfffffffffffffffe);
  if (*piVar6 != 0x7fffffff) {
    piVar6[1] = piVar6[1] + 1;
    i_00 = 0xffffffff;
    if (*piVar6 != 0x7fffffff) {
      iVar7 = 1000000000;
      pDVar5 = pDVar3;
      do {
        i = pDVar5->index;
        iVar1 = Cudd_EstimateCofactor(dd,f,i,1);
        iVar2 = Cudd_EstimateCofactor(dd,f,i,0);
        if (iVar2 < iVar1) {
          iVar2 = iVar1;
        }
        if (iVar2 < iVar7) {
          i_00 = i;
          iVar7 = iVar2;
        }
        pDVar5 = (pDVar5->type).kids.T;
      } while (*(int *)((ulong)pDVar5 & 0xfffffffffffffffe) != 0x7fffffff);
    }
    Cudd_RecursiveDeref(dd,pDVar3);
    pDVar5 = Cudd_bddIthVar(dd,i_00);
    pDVar3 = Cudd_bddOr(dd,f,pDVar5);
    if (pDVar3 != (DdNode *)0x0) {
      piVar6 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar6 = *piVar6 + 1;
      pDVar5 = Cudd_bddOr(dd,f,(DdNode *)((ulong)pDVar5 ^ 1));
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar3);
      }
      else {
        piVar6 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar6 = *piVar6 + 1;
        if (pDVar3 == dd->one) {
          Cudd_RecursiveDeref(dd,pDVar3);
          ppDVar4 = (DdNode **)malloc(8);
          *conjuncts = ppDVar4;
          pDVar3 = pDVar5;
          if (ppDVar4 != (DdNode **)0x0) {
            *ppDVar4 = pDVar5;
            return 1;
          }
        }
        else if (pDVar5 == dd->one) {
          Cudd_RecursiveDeref(dd,pDVar5);
          ppDVar4 = (DdNode **)malloc(8);
          *conjuncts = ppDVar4;
          if (ppDVar4 != (DdNode **)0x0) {
            *ppDVar4 = pDVar3;
            return 1;
          }
        }
        else {
          ppDVar4 = (DdNode **)malloc(0x10);
          *conjuncts = ppDVar4;
          if (ppDVar4 != (DdNode **)0x0) {
            *ppDVar4 = pDVar3;
            ppDVar4[1] = pDVar5;
            return 2;
          }
          Cudd_RecursiveDeref(dd,pDVar3);
          pDVar3 = pDVar5;
        }
        Cudd_RecursiveDeref(dd,pDVar3);
        dd->errorCode = CUDD_MEMORY_OUT;
      }
    }
    return 0;
  }
  ppDVar4 = (DdNode **)malloc(8);
  *conjuncts = ppDVar4;
  if (ppDVar4 != (DdNode **)0x0) {
    *ppDVar4 = f;
    piVar6 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
    *piVar6 = *piVar6 + 1;
    return 1;
  }
  dd->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
Cudd_bddVarConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    int best;
    int min;
    DdNode *support, *scan, *var, *glocal, *hlocal;

    /* Find best cofactoring variable. */
    support = Cudd_Support(dd,f);
    if (support == NULL) return(0);
    if (Cudd_IsConstant(support)) {
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = f;
        cuddRef((*conjuncts)[0]);
        return(1);
    }
    cuddRef(support);
    min = 1000000000;
    best = -1;
    scan = support;
    while (!Cudd_IsConstant(scan)) {
        int i = scan->index;
        int est1 = Cudd_EstimateCofactor(dd,f,i,1);
        int est0 = Cudd_EstimateCofactor(dd,f,i,0);
        /* Minimize the size of the larger of the two cofactors. */
        int est = (est1 > est0) ? est1 : est0;
        if (est < min) {
            min = est;
            best = i;
        }
        scan = cuddT(scan);
    }
#ifdef DD_DEBUG
    assert(best >= 0 && best < dd->size);
#endif
    Cudd_RecursiveDeref(dd,support);

    var = Cudd_bddIthVar(dd,best);
    glocal = Cudd_bddOr(dd,f,var);
    if (glocal == NULL) {
        return(0);
    }
    cuddRef(glocal);
    hlocal = Cudd_bddOr(dd,f,Cudd_Not(var));
    if (hlocal == NULL) {
        Cudd_RecursiveDeref(dd,glocal);
        return(0);
    }
    cuddRef(hlocal);

    if (glocal != DD_ONE(dd)) {
        if (hlocal != DD_ONE(dd)) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}